

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

bool __thiscall Texture::loadRGB(Texture *this,string *path)

{
  bool bVar1;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)path);
  bVar1 = _loadTextureFromFile(this,&local_38,3,true);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar1;
}

Assistant:

bool Texture::loadRGB(std::string path) {
    return _loadTextureFromFile(path, STBI_rgb);
}